

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb<char,_false,_5>_> __thiscall
immutable::rrb_update<char,false,5>
          (immutable *this,ref<immutable::rrb<char,_false,_5>_> *in,uint32_t index,char element)

{
  ref<immutable::rrb_details::internal_node<char,_false>_> *prVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  rrb<char,_false,_5> *prVar4;
  rrb<char,_false,_5> *prVar5;
  internal_node<char,_false> *piVar6;
  leaf_node<char,_false> *plVar7;
  undefined7 in_register_00000009;
  uint uVar8;
  uint32_t uVar9;
  ref<immutable::rrb_details::internal_node<char,false>> *this_00;
  ref<immutable::rrb_details::internal_node<char,_false>_> current;
  ref<immutable::rrb_details::leaf_node<char,_false>_> leaf;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_60;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_58;
  uint32_t local_4c;
  rrb<char,_false,_5> *local_48;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_40;
  undefined4 local_34;
  
  local_4c = index;
  prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
  if (index < prVar4->cnt) {
    prVar4 = rrb_details::rrb_head_clone<char,false,5>(in->ptr);
    *(rrb<char,_false,_5> **)this = prVar4;
    if (prVar4 != (rrb<char,_false,_5> *)0x0) {
      prVar4->_ref_count = 1;
    }
    prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
    uVar9 = prVar4->cnt;
    prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
    uVar8 = uVar9 - prVar4->tail_len;
    if (index < uVar8) {
      local_34 = (undefined4)CONCAT71(in_register_00000009,element);
      local_48 = (rrb<char,_false,_5> *)this;
      prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->
                         ((ref<immutable::rrb<char,_false,_5>_> *)this);
      prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
      local_60.ptr = (internal_node<char,_false> *)(prVar5->root).ptr;
      if (local_60.ptr != (internal_node<char,_false> *)0x0) {
        (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
      }
      this_00 = (ref<immutable::rrb_details::internal_node<char,false>> *)&prVar4->root;
      prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
      for (uVar9 = prVar4->shift; uVar9 != 0; uVar9 = uVar9 - 5) {
        local_58.ptr = rrb_details::internal_node_clone<char,false>(local_60.ptr);
        if (local_58.ptr != (internal_node<char,_false> *)0x0) {
          (local_58.ptr)->_ref_count = 1;
        }
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=(&local_60,&local_58);
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_58);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this_00,&local_60);
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_60);
        if ((piVar6->size_table).ptr == (rrb_size_table<false> *)0x0) {
          uVar3 = local_4c >> ((byte)uVar9 & 0x1f) & 0x1f;
        }
        else {
          uVar3 = rrb_details::sized_pos<char,false>(local_60.ptr,&local_4c,uVar9);
        }
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_60);
        prVar1 = piVar6->child;
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_60);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  (&local_60,piVar6->child + uVar3);
        this_00 = (ref<immutable::rrb_details::internal_node<char,false>> *)(prVar1 + uVar3);
      }
      local_58.ptr = local_60.ptr;
      if (local_60.ptr != (internal_node<char,_false> *)0x0) {
        (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
      }
      local_40.ptr = rrb_details::leaf_node_clone<char,false>
                               ((leaf_node<char,_false> *)local_60.ptr);
      uVar2 = local_34;
      this = (immutable *)local_48;
      if (local_40.ptr != (leaf_node<char,_false> *)0x0) {
        (local_40.ptr)->_ref_count = 1;
      }
      ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58,&local_40);
      rrb_details::release<char>(local_40.ptr);
      ref<immutable::rrb_details::internal_node<char,false>>::operator=
                (this_00,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58);
      plVar7 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58);
      plVar7->child[local_4c & 0x1f] = (char)uVar2;
      rrb_details::release<char>((leaf_node<char,_false> *)local_58.ptr);
      ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_60);
    }
    else {
      prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
      local_60.ptr = (internal_node<char,_false> *)
                     rrb_details::leaf_node_clone<char,false>((prVar4->tail).ptr);
      if (local_60.ptr != (internal_node<char,_false> *)0x0) {
        (local_60.ptr)->_ref_count = 1;
      }
      plVar7 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_60);
      plVar7->child[index - uVar8] = element;
      prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->
                         ((ref<immutable::rrb<char,_false,_5>_> *)this);
      ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                (&prVar4->tail,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_60);
      rrb_details::release<char>((leaf_node<char,_false> *)local_60.ptr);
    }
    return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
  }
  __assert_fail("index < in->cnt",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x79b,
                "ref<rrb<T, atomic_ref_counting, N>> immutable::rrb_update(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t, T) [T = char, atomic_ref_counting = false, N = 5]"
               );
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_update(const ref<rrb<T, atomic_ref_counting, N>>& in, uint32_t index, T element)
    {
    using namespace rrb_details;
    assert(index < in->cnt);
    ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone(in.ptr);
    const uint32_t tail_offset = in->cnt - in->tail_len;
    if (tail_offset <= index)
      {
      ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_clone(in->tail.ptr);
      new_tail->child[index - tail_offset] = std::move(element);
      new_rrb->tail = new_tail;
      return new_rrb;
      }
    ref<internal_node<T, atomic_ref_counting>>* previous_pointer = (ref<internal_node<T, atomic_ref_counting>>*)&new_rrb->root;
    ref<internal_node<T, atomic_ref_counting>> current = in->root;
    for (uint32_t shift = in->shift; shift > 0; shift -= bits<N>::rrb_bits)
      {
      current = internal_node_clone(current.ptr);
      *previous_pointer = current;

      uint32_t child_index;
      if (current->size_table.ptr == nullptr)
        {
        child_index = (index >> shift) & bits<N>::rrb_mask;
        }
      else
        {
        child_index = sized_pos(current.ptr, &index, shift);
        }
      previous_pointer = &current->child[child_index];
      current = current->child[child_index];
      }
    ref<leaf_node<T, atomic_ref_counting>> leaf = current;
    leaf = leaf_node_clone(leaf.ptr);
    *previous_pointer = leaf;
    leaf->child[index & bits<N>::rrb_mask] = std::move(element);
    return new_rrb;
    }